

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::resize
          (QList<QStyleOptionViewItem::ViewItemPosition> *this,qsizetype size)

{
  ViewItemPosition *pVVar1;
  Data *pDVar2;
  ViewItemPosition *pVVar3;
  long lVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) <
      size)) {
    QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(ViewItemPosition **)0x0,
               (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *)0x0);
    lVar4 = (this->d).size;
  }
  else {
    lVar4 = (this->d).size;
    if (size < lVar4) goto LAB_005a9be8;
  }
  if (size <= lVar4) {
    return;
  }
  pVVar3 = (this->d).ptr;
  pVVar1 = pVVar3 + lVar4;
  *pVVar1 = Invalid;
  if (pVVar1 + 1 != pVVar3 + size) {
    memset(pVVar1 + 1,0,(size * 4 + lVar4 * -4) - 4);
  }
LAB_005a9be8:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }